

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
bitmanip::detail::stringify_impl<unsigned_int,3ul>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,detail *this,uint (*arr) [3])

{
  string local_90;
  ulong local_70;
  size_t i;
  string local_58;
  undefined1 local_38 [8];
  string result;
  uint (*arr_local) [3];
  
  result.field_2._8_8_ = this;
  stringify_impl<unsigned_int>(&local_58,(uint *)this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,"{",
                 &local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::length();
  std::__cxx11::string::reserve((ulong)local_38);
  for (local_70 = 1; local_70 < 3; local_70 = local_70 + 1) {
    std::__cxx11::string::operator+=((string *)local_38,", ");
    stringify_impl<unsigned_int>(&local_90,(uint *)(result.field_2._8_8_ + local_70 * 4));
    std::__cxx11::string::operator+=((string *)local_38,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,'}');
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

auto stringify_impl(const T (&arr)[N])
{
    std::string result = "{" + stringify_impl(arr[0]);
    result.reserve((result.length() + 1) * N + 1);

    for (std::size_t i = 1; i < N; ++i) {
        result += ", ";
        result += stringify_impl(arr[i]);
    }

    return result + '}';
}